

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# randomizer_world.cpp
# Opt level: O0

void __thiscall RandomizerWorld::dark_region(RandomizerWorld *this,WorldRegion *region)

{
  WorldNode *this_00;
  WorldPath *this_01;
  bool bVar1;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *dark_maps;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> *this_02;
  reference ppWVar2;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> *this_03;
  reference ppWVar3;
  WorldNode *this_04;
  WorldRegion *pWVar4;
  Item *item;
  allocator<char> local_79;
  string local_78;
  WorldPath *local_58;
  WorldPath *path;
  const_iterator __end2;
  const_iterator __begin2;
  vector<WorldPath_*,_std::allocator<WorldPath_*>_> *__range2;
  WorldNode *node;
  const_iterator __end1;
  const_iterator __begin1;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> *__range1;
  WorldRegion *region_local;
  RandomizerWorld *this_local;
  
  this->_dark_region = region;
  dark_maps = WorldRegion::dark_map_ids(region);
  World::dark_maps(&this->super_World,dark_maps);
  this_02 = WorldRegion::nodes(region);
  __end1 = std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>::begin(this_02);
  node = (WorldNode *)std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>::end(this_02);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<WorldNode_*const_*,_std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>_>
                      (&__end1,(__normal_iterator<WorldNode_*const_*,_std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>_>
                                *)&node);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    ppWVar2 = __gnu_cxx::
              __normal_iterator<WorldNode_*const_*,_std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppWVar2;
    this_03 = WorldNode::ingoing_paths(this_00);
    __end2 = std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::begin(this_03);
    path = (WorldPath *)std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>::end(this_03);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<WorldPath_*const_*,_std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>_>
                        (&__end2,(__normal_iterator<WorldPath_*const_*,_std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>_>
                                  *)&path);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      ppWVar3 = __gnu_cxx::
                __normal_iterator<WorldPath_*const_*,_std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>_>
                ::operator*(&__end2);
      local_58 = *ppWVar3;
      this_04 = WorldPath::origin(local_58);
      pWVar4 = WorldNode::region(this_04);
      this_01 = local_58;
      if (pWVar4 != region) {
        item = World::item(&this->super_World,'\x1a');
        WorldPath::add_required_item(this_01,item);
      }
      __gnu_cxx::
      __normal_iterator<WorldPath_*const_*,_std::vector<WorldPath_*,_std::allocator<WorldPath_*>_>_>
      ::operator++(&__end2);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"in a very dark place",&local_79);
    WorldNode::add_hint(this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    __gnu_cxx::
    __normal_iterator<WorldNode_*const_*,_std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>_>::
    operator++(&__end1);
  }
  return;
}

Assistant:

void RandomizerWorld::dark_region(WorldRegion* region)
{
    _dark_region = region;
    this->dark_maps(region->dark_map_ids());

    for(WorldNode* node : region->nodes())
    {
        for (WorldPath* path : node->ingoing_paths())
            if(path->origin()->region() != region)
                path->add_required_item(this->item(ITEM_LANTERN));

        node->add_hint("in a very dark place");
    }
}